

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

HaF32 * __thiscall
HACD::MyWuQuantizer::wuQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *outputVertices;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  uint uVar6;
  ulong uVar7;
  Vec3 *pVVar8;
  uint uVar9;
  Vec3 *pVVar10;
  long lVar11;
  undefined8 *puVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  WuColorQuantizer wcq;
  WuColorQuantizer local_458;
  
  *outputCount = 0;
  normalizeInput(this,vcount,vertices);
  WuColorQuantizer::WuColorQuantizer(&local_458);
  if (vcount != 0) {
    lVar11 = 8;
    uVar13 = 0;
    do {
      if ((this->mNormalizedInput).mSize <= uVar13) goto LAB_0084e7ad;
      pVVar10 = (this->mNormalizedInput).mData;
      WuColorQuantizer::addColor
                (&local_458,*(HaF32 *)((long)pVVar10 + lVar11 + -8),
                 *(HaF32 *)((long)pVVar10 + lVar11 + -4),*(HaF32 *)((long)&pVVar10->x + lVar11));
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0xc;
    } while (vcount != uVar13);
  }
  outputVertices = &this->mQuantizedOutput;
  WuColorQuantizer::Quantize(&local_458,maxVertices,outputVertices);
  uVar6 = (this->mQuantizedOutput).mSize;
  *outputCount = uVar6;
  if (uVar6 == 0) {
    pVVar10 = (Vec3 *)0x0;
  }
  else {
    if (denormalizeResults) {
      lVar11 = 0;
      uVar13 = 0;
      do {
        uVar7 = (ulong)uVar6;
        if (uVar7 <= uVar13) goto LAB_0084e7ad;
        pVVar10 = (this->mQuantizedOutput).mData;
        auVar14 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),
                                  ZEXT416(*(uint *)((long)&pVVar10->x + lVar11)),
                                  ZEXT416((uint)(this->mCenter).x));
        auVar15._0_4_ = auVar14._0_4_;
        *(undefined4 *)((long)&pVVar10->x + lVar11) = auVar15._0_4_;
        auVar15._4_4_ = auVar15._0_4_;
        auVar15._8_4_ = auVar15._0_4_;
        auVar15._12_4_ = auVar15._0_4_;
        uVar1 = (this->mScale).y;
        uVar4 = (this->mScale).z;
        auVar14._4_4_ = uVar4;
        auVar14._0_4_ = uVar1;
        auVar14._8_8_ = 0;
        uVar2 = (this->mCenter).y;
        uVar5 = (this->mCenter).z;
        auVar16._4_4_ = uVar5;
        auVar16._0_4_ = uVar2;
        auVar16._8_8_ = 0;
        auVar14 = vfmadd213ps_fma(auVar15,auVar14,auVar16);
        uVar3 = vmovlps_avx(auVar14);
        *(undefined8 *)((long)&pVVar10->y + lVar11) = uVar3;
        uVar9 = (this->mQuantizedOutput).mCapacity & 0x7fffffff;
        pVVar8 = pVVar10;
        if (uVar9 <= uVar6) {
          uVar6 = uVar9 * 2;
          if (uVar9 == 0) {
            uVar6 = 1;
          }
          if (uVar6 <= uVar9) {
            __assert_fail("this->capacity() < capacity",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                          ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
          }
          hacd::vector<HACD::Vec3>::recreate(outputVertices,uVar6);
          uVar7 = (ulong)(this->mQuantizedOutput).mSize;
          pVVar8 = (this->mQuantizedOutput).mData;
        }
        puVar12 = (undefined8 *)((long)&pVVar10->x + lVar11);
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0xc;
        pVVar8[uVar7].z = *(HaF32 *)(puVar12 + 1);
        uVar3 = *puVar12;
        pVVar8[uVar7].x = (HaF32)(int)uVar3;
        pVVar8[uVar7].y = (HaF32)(int)((ulong)uVar3 >> 0x20);
        uVar6 = (this->mQuantizedOutput).mSize + 1;
        (this->mQuantizedOutput).mSize = uVar6;
      } while (uVar13 < *outputCount);
      if (uVar6 == 0) {
LAB_0084e7ad:
        __assert_fail("i < mSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                      ,0x93,"T &hacd::vector<HACD::Vec3>::operator[](HaU32) [T = HACD::Vec3]");
      }
    }
    pVVar10 = outputVertices->mData;
  }
  WuColorQuantizer::~WuColorQuantizer(&local_458);
  return &pVVar10->x;
}

Assistant:

virtual const hacd::HaF32 * wuQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;

		normalizeInput(vcount,vertices);

		WuColorQuantizer wcq;

		for (HaU32 i=0; i<vcount; i++)
		{
			const Vec3 &v = mNormalizedInput[i];
			wcq.addColor(v.x,v.y,v.z);
		}

		wcq.Quantize(maxVertices,mQuantizedOutput);

		outputCount = (HaU32)mQuantizedOutput.size();

		if ( outputCount > 0 )
		{
			if ( denormalizeResults )
			{
				for (HaU32 i=0; i<outputCount; i++)
				{
					Vec3 &v = mQuantizedOutput[i];
					v.x = v.x*mScale.x + mCenter.x;
					v.y = v.x*mScale.y + mCenter.y;
					v.z = v.x*mScale.z + mCenter.z;
					mQuantizedOutput.push_back(v);
				}
			}
			ret = &mQuantizedOutput[0].x;
		}


		return ret;
	}